

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

string * sensors_analytics::HttpSender::Base64Encode(string *__return_storage_ptr__,string *data)

{
  undefined6 uVar1;
  byte bVar2;
  byte bVar3;
  ulong in_RAX;
  byte bVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  pointer pcVar8;
  size_type sVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  undefined8 local_38;
  
  pcVar8 = (data->_M_dataplus)._M_p;
  sVar9 = data->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar7 = (char)__return_storage_ptr__;
  uVar10 = 0;
  for (; iVar6 = (int)uVar10, local_38 = in_RAX, sVar9 != 0; sVar9 = sVar9 - 1) {
    uVar11 = (ulong)(iVar6 + 1U);
    *(char *)((long)&local_38 + uVar10 + 1) = *pcVar8;
    if (iVar6 + 1U == 3) {
      local_38._1_1_ = (byte)(in_RAX >> 8);
      bVar2 = local_38._1_1_;
      local_38._2_1_ = (byte)(in_RAX >> 0x10);
      bVar3 = local_38._2_1_;
      bVar4 = local_38._1_1_ >> 2;
      local_38._0_4_ = (undefined4)in_RAX;
      local_38._0_5_ = CONCAT14(bVar4,(undefined4)local_38);
      local_38._0_6_ = CONCAT15((bVar2 & 3) << 4 | bVar3 >> 4,(undefined5)local_38);
      uVar1 = (undefined6)local_38;
      local_38._3_1_ = (byte)(in_RAX >> 0x18);
      bVar2 = local_38._3_1_;
      local_38._0_7_ = CONCAT16((bVar3 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
      local_38 = CONCAT17(bVar2,(undefined7)local_38) & 0x3fffffffffffffff;
      lVar12 = 0;
      do {
        std::__cxx11::string::push_back(cVar7);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      uVar11 = 0;
    }
    pcVar8 = pcVar8 + 1;
    uVar10 = uVar11;
    in_RAX = local_38;
  }
  if (iVar6 != 0) {
    if (iVar6 < 3) {
      memset((void *)((long)&local_38 + uVar10 + 1),0,(ulong)(2 - iVar6) + 1);
    }
    uVar10 = local_38;
    bVar2 = local_38._1_1_;
    bVar3 = local_38._2_1_;
    bVar4 = local_38._1_1_ >> 2;
    local_38._0_5_ = CONCAT14(bVar4,(undefined4)local_38);
    local_38._0_6_ = CONCAT15((bVar2 & 3) << 4 | bVar3 >> 4,(undefined5)local_38);
    uVar1 = (undefined6)local_38;
    local_38._3_1_ = SUB81(uVar10,3);
    bVar2 = local_38._3_1_;
    local_38._0_7_ = CONCAT16((bVar3 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
    local_38 = CONCAT17(bVar2,(undefined7)local_38) & 0x3fffffffffffffff;
    if (-1 < iVar6) {
      uVar10 = 0;
      do {
        std::__cxx11::string::push_back(cVar7);
        uVar10 = uVar10 + 1;
      } while (iVar6 + 1 != uVar10);
    }
    iVar5 = 3;
    if (3 < iVar6) {
      iVar5 = iVar6;
    }
    iVar6 = (iVar5 - iVar6) + 1;
    while (iVar6 = iVar6 + -1, iVar6 != 0) {
      std::__cxx11::string::push_back(cVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpSender::Base64Encode(const string &data) {
  const unsigned char
      *bytes_to_encode = reinterpret_cast<const unsigned char *>(data.data());
  size_t in_len = data.length();
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3];
  unsigned char char_array_4[4];

  while (in_len-- > 0) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++)
        ret += kBase64Chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i != 0) {
    for (j = i; j < 3; j++)
      char_array_3[j] = '\0';
    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;
    for (j = 0; (j < i + 1); j++)
      ret += kBase64Chars[char_array_4[j]];
    while ((i++ < 3))
      ret += '=';
  }
  return ret;
}